

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

bool __thiscall helics::MessageFederateManager::hasMessage(MessageFederateManager *this)

{
  bool bVar1;
  _Elt_pointer pEVar2;
  EndpointData *mq;
  _Elt_pointer pEVar3;
  _Map_pointer ppEVar4;
  pthread_rwlock_t *__rwlock;
  _Elt_pointer pEVar5;
  bool bVar6;
  
  bVar1 = (this->eptData).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->eptData).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  pEVar3 = (this->eptData).m_obj.
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar2 = (this->eptData).m_obj.
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  bVar6 = pEVar3 != pEVar2;
  if (bVar6) {
    pEVar5 = (this->eptData).m_obj.
             super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppEVar4 = (this->eptData).m_obj.
              super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (((pEVar3->messages).queueEmptyFlag._M_base._M_i & 1U) == 0) break;
      pEVar3 = pEVar3 + 1;
      if (pEVar3 == pEVar5) {
        pEVar3 = ppEVar4[1];
        ppEVar4 = ppEVar4 + 1;
        pEVar5 = pEVar3 + 3;
      }
      bVar6 = pEVar3 != pEVar2;
    } while (bVar6);
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return bVar6;
}

Assistant:

bool MessageFederateManager::hasMessage() const
{
    auto eptDat = eptData.lock_shared();
    for (const auto& mq : eptDat) {
        if (!mq.messages.empty()) {
            return true;
        }
    }
    return false;
}